

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O1

void __thiscall NaParams::ListOfParamsToLog(NaParams *this)

{
  long lVar1;
  long lVar2;
  
  NaPrintLog("----------------------------->8----------------------------\n");
  if (0 < this->stored_n) {
    lVar2 = 8;
    lVar1 = 0;
    do {
      NaPrintLog("%s=%s\n",*(undefined8 *)((long)this->storage + lVar2 + -8),
                 *(undefined8 *)((long)&this->storage->name + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar1 < this->stored_n);
  }
  NaPrintLog("-----------------------------8<----------------------------\n");
  return;
}

Assistant:

void
NaParams::ListOfParamsToLog () const
{
  int	i;
  NaPrintLog("----------------------------->8----------------------------\n");
  for(i = 0; i < stored_n; ++i)
    NaPrintLog("%s=%s\n", storage[i].name, storage[i].value);
  NaPrintLog("-----------------------------8<----------------------------\n");
}